

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::CreateElementsSignatureHash
          (JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::CreateElementsSignatureHashRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::CreateSignatureHashResponseStruct(cfd::js::api::CreateElementsSignatureHashRequestStruct_const&)>
  ::
  function<cfd::js::api::CreateSignatureHashResponseStruct(&)(cfd::js::api::CreateElementsSignatureHashRequestStruct_const&),void>
            ((function<cfd::js::api::CreateSignatureHashResponseStruct(cfd::js::api::CreateElementsSignatureHashRequestStruct_const&)>
              *)&local_38,ElementsTransactionStructApi::CreateSignatureHash);
  ExecuteJsonApi<cfd::js::api::json::CreateElementsSignatureHashRequest,cfd::js::api::json::CreateSignatureHashResponse,cfd::js::api::CreateElementsSignatureHashRequestStruct,cfd::js::api::CreateSignatureHashResponseStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::CreateSignatureHashResponseStruct_(const_cfd::js::api::CreateElementsSignatureHashRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::CreateElementsSignatureHash(
    const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::CreateElementsSignatureHashRequest,
      api::json::CreateSignatureHashResponse,
      api::CreateElementsSignatureHashRequestStruct,
      api::CreateSignatureHashResponseStruct>(
      request_message, ElementsTransactionStructApi::CreateSignatureHash);
}